

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextGLImpl::SetPipelineState
          (DeviceContextGLImpl *this,IPipelineState *pPipelineState)

{
  undefined *puVar1;
  bool bVar2;
  Uint32 RenderTargetMask;
  PipelineStateGLImpl *pPVar3;
  PipelineStateDesc *Args_1;
  GraphicsPipelineDesc *BSDsc_00;
  undefined8 uVar4;
  char (*in_R9) [29];
  Uint32 local_cc;
  char *pcStack_c8;
  Uint32 DvpCompatibleSRBCount;
  undefined1 local_c0 [8];
  string _msg_2;
  StencilOpDesc *BackFace;
  StencilOpDesc *FrontFace;
  DepthStencilStateDesc *DepthStencilDesc;
  BlendStateDesc *BSDsc;
  string _msg_1;
  undefined1 local_50 [8];
  string _msg;
  RasterizerStateDesc *RasterizerDesc;
  GraphicsPipelineDesc *GraphicsPipeline;
  PipelineStateDesc *Desc;
  IPipelineState *pPipelineState_local;
  DeviceContextGLImpl *this_local;
  
  bVar2 = DeviceContextBase<Diligent::EngineGLImplTraits>::SetPipelineState
                    (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,pPipelineState,
                     (INTERFACE_ID *)PipelineStateGLImpl::IID_InternalImpl);
  if (bVar2) {
    pPVar3 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->
                       (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                         m_pPipelineState);
    Args_1 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetDesc
                       (&pPVar3->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
    if (Args_1->PipelineType != PIPELINE_TYPE_COMPUTE) {
      if (Args_1->PipelineType != PIPELINE_TYPE_GRAPHICS) {
        pcStack_c8 = GetPipelineTypeString(Args_1->PipelineType);
        FormatString<char_const*,char[12],char_const*,char[29]>
                  ((string *)local_c0,(Diligent *)&stack0xffffffffffffff38,(char **)0xe5826f,
                   (char (*) [12])Args_1,(char **)"\' is not supported in OpenGL",in_R9);
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar4 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(2,uVar4,0);
        }
        std::__cxx11::string::~string((string *)local_c0);
        return;
      }
      pPVar3 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->
                         (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                           m_pPipelineState);
      BSDsc_00 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                           (&pPVar3->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
      _msg.field_2._8_8_ = &BSDsc_00->RasterizerDesc;
      GLContextState::SetFillMode
                (&this->m_ContextState,((RasterizerStateDesc *)_msg.field_2._8_8_)->FillMode);
      GLContextState::SetCullMode(&this->m_ContextState,*(CULL_MODE *)(_msg.field_2._8_8_ + 1));
      GLContextState::SetFrontFace
                (&this->m_ContextState,(bool)(*(byte *)(_msg.field_2._8_8_ + 2) & 1));
      GLContextState::SetDepthBias
                (&this->m_ContextState,(float)*(int *)(_msg.field_2._8_8_ + 8),
                 *(float *)(_msg.field_2._8_8_ + 0x10));
      if ((*(float *)(_msg.field_2._8_8_ + 0xc) != 0.0) ||
         (NAN(*(float *)(_msg.field_2._8_8_ + 0xc)))) {
        FormatString<char[44]>
                  ((string *)local_50,(char (*) [44])"Depth bias clamp is not supported on OpenGL");
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar4 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(1,uVar4,0);
        }
        std::__cxx11::string::~string((string *)local_50);
      }
      GLContextState::SetDepthClamp
                (&this->m_ContextState,(bool)((*(byte *)(_msg.field_2._8_8_ + 3) ^ 0xff) & 1));
      GLContextState::EnableScissorTest
                (&this->m_ContextState,(bool)(*(byte *)(_msg.field_2._8_8_ + 4) & 1));
      if ((*(byte *)(_msg.field_2._8_8_ + 5) & 1) != 0) {
        FormatString<char[45]>
                  ((string *)&BSDsc,(char (*) [45])"Line antialiasing is not supported on OpenGL");
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar4 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(1,uVar4,0);
        }
        std::__cxx11::string::~string((string *)&BSDsc);
      }
      pPVar3 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->
                         (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                           m_pPipelineState);
      RenderTargetMask =
           PipelineStateBase<Diligent::EngineGLImplTraits>::GetRenderTargetMask
                     (&pPVar3->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
      GLContextState::SetBlendState
                (&this->m_ContextState,&BSDsc_00->BlendDesc,RenderTargetMask,BSDsc_00->SampleMask);
      GLContextState::EnableDepthTest
                (&this->m_ContextState,(bool)((BSDsc_00->DepthStencilDesc).DepthEnable & 1));
      GLContextState::EnableDepthWrites
                (&this->m_ContextState,(bool)((BSDsc_00->DepthStencilDesc).DepthWriteEnable & 1));
      GLContextState::SetDepthFunc(&this->m_ContextState,(BSDsc_00->DepthStencilDesc).DepthFunc);
      GLContextState::EnableStencilTest
                (&this->m_ContextState,(bool)((BSDsc_00->DepthStencilDesc).StencilEnable & 1));
      GLContextState::SetStencilWriteMask
                (&this->m_ContextState,(BSDsc_00->DepthStencilDesc).StencilWriteMask);
      GLContextState::SetStencilFunc
                (&this->m_ContextState,0x404,(BSDsc_00->DepthStencilDesc).FrontFace.StencilFunc,
                 (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_StencilRef,
                 (uint)(BSDsc_00->DepthStencilDesc).StencilReadMask);
      GLContextState::SetStencilOp
                (&this->m_ContextState,0x404,(BSDsc_00->DepthStencilDesc).FrontFace.StencilFailOp,
                 (BSDsc_00->DepthStencilDesc).FrontFace.StencilDepthFailOp,
                 (BSDsc_00->DepthStencilDesc).FrontFace.StencilPassOp);
      _msg_2.field_2._8_8_ = &(BSDsc_00->DepthStencilDesc).BackFace;
      GLContextState::SetStencilFunc
                (&this->m_ContextState,0x405,(BSDsc_00->DepthStencilDesc).BackFace.StencilFunc,
                 (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_StencilRef,
                 (uint)(BSDsc_00->DepthStencilDesc).StencilReadMask);
      GLContextState::SetStencilOp
                (&this->m_ContextState,0x405,*(STENCIL_OP *)_msg_2.field_2._8_8_,
                 *(STENCIL_OP *)(_msg_2.field_2._8_8_ + 1),*(STENCIL_OP *)(_msg_2.field_2._8_8_ + 2)
                );
      GLContextState::InvalidateVAO(&this->m_ContextState);
      this->m_DrawBuffersCommitted = false;
    }
    pPVar3 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->
                       (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                         m_pPipelineState);
    PipelineStateGLImpl::CommitProgram(pPVar3,&this->m_ContextState);
    local_cc = 0;
    DeviceContextBase<Diligent::EngineGLImplTraits>::PrepareCommittedResources
              (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,
               &(this->m_BindInfo).super_CommittedShaderResources,&local_cc);
  }
  return;
}

Assistant:

void DeviceContextGLImpl::SetPipelineState(IPipelineState* pPipelineState)
{
    if (!TDeviceContextBase::SetPipelineState(pPipelineState, PipelineStateGLImpl::IID_InternalImpl))
        return;

    const PipelineStateDesc& Desc = m_pPipelineState->GetDesc();
    if (Desc.PipelineType == PIPELINE_TYPE_COMPUTE)
    {
    }
    else if (Desc.PipelineType == PIPELINE_TYPE_GRAPHICS)
    {
        const GraphicsPipelineDesc& GraphicsPipeline = m_pPipelineState->GetGraphicsPipelineDesc();
        // Set rasterizer state
        {
            const RasterizerStateDesc& RasterizerDesc = GraphicsPipeline.RasterizerDesc;

            m_ContextState.SetFillMode(RasterizerDesc.FillMode);
            m_ContextState.SetCullMode(RasterizerDesc.CullMode);
            m_ContextState.SetFrontFace(RasterizerDesc.FrontCounterClockwise);
            m_ContextState.SetDepthBias(static_cast<Float32>(RasterizerDesc.DepthBias), RasterizerDesc.SlopeScaledDepthBias);
            if (RasterizerDesc.DepthBiasClamp != 0)
                LOG_WARNING_MESSAGE("Depth bias clamp is not supported on OpenGL");

            // Enabling depth clamping in GL is the same as disabling clipping in Direct3D.
            // https://docs.microsoft.com/en-us/windows/win32/api/d3d11/ns-d3d11-d3d11_rasterizer_desc
            // https://www.khronos.org/opengl/wiki/GLAPI/glEnable
            m_ContextState.SetDepthClamp(!RasterizerDesc.DepthClipEnable);

            m_ContextState.EnableScissorTest(RasterizerDesc.ScissorEnable);
            if (RasterizerDesc.AntialiasedLineEnable)
                LOG_WARNING_MESSAGE("Line antialiasing is not supported on OpenGL");
        }

        // Set blend state
        {
            const BlendStateDesc& BSDsc = GraphicsPipeline.BlendDesc;
            m_ContextState.SetBlendState(BSDsc, m_pPipelineState->GetRenderTargetMask(), GraphicsPipeline.SampleMask);
        }

        // Set depth-stencil state
        {
            const DepthStencilStateDesc& DepthStencilDesc = GraphicsPipeline.DepthStencilDesc;

            m_ContextState.EnableDepthTest(DepthStencilDesc.DepthEnable);
            m_ContextState.EnableDepthWrites(DepthStencilDesc.DepthWriteEnable);
            m_ContextState.SetDepthFunc(DepthStencilDesc.DepthFunc);
            m_ContextState.EnableStencilTest(DepthStencilDesc.StencilEnable);
            m_ContextState.SetStencilWriteMask(DepthStencilDesc.StencilWriteMask);

            {
                const StencilOpDesc& FrontFace = DepthStencilDesc.FrontFace;
                m_ContextState.SetStencilFunc(GL_FRONT, FrontFace.StencilFunc, m_StencilRef, DepthStencilDesc.StencilReadMask);
                m_ContextState.SetStencilOp(GL_FRONT, FrontFace.StencilFailOp, FrontFace.StencilDepthFailOp, FrontFace.StencilPassOp);
            }

            {
                const StencilOpDesc& BackFace = DepthStencilDesc.BackFace;
                m_ContextState.SetStencilFunc(GL_BACK, BackFace.StencilFunc, m_StencilRef, DepthStencilDesc.StencilReadMask);
                m_ContextState.SetStencilOp(GL_BACK, BackFace.StencilFailOp, BackFace.StencilDepthFailOp, BackFace.StencilPassOp);
            }
        }
        m_ContextState.InvalidateVAO();
        m_DrawBuffersCommitted = false;
    }
    else
    {
        LOG_ERROR_MESSAGE(GetPipelineTypeString(Desc.PipelineType), " pipeline '", Desc.Name, "' is not supported in OpenGL");
        return;
    }

    // Note that the program may change if a shader is created after the call
    // (ShaderResourcesGL needs to bind a program to load uniforms), but before
    // the draw command.
    m_pPipelineState->CommitProgram(m_ContextState);

    Uint32 DvpCompatibleSRBCount = 0;
    PrepareCommittedResources(m_BindInfo, DvpCompatibleSRBCount);
}